

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

string * transcode_utf8(string *__return_storage_ptr__,string *utf8_val,encoding_e encoding,
                       char unknown)

{
  char unknown_local;
  encoding_e encoding_local;
  string *utf8_val_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  transcode_utf8(utf8_val,__return_storage_ptr__,encoding,unknown);
  return __return_storage_ptr__;
}

Assistant:

static std::string
transcode_utf8(std::string const& utf8_val, encoding_e encoding, char unknown)
{
    std::string result;
    transcode_utf8(utf8_val, result, encoding, unknown);
    return result;
}